

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O0

int csp_zmqhub_init_w_name_endpoints_rxfilter
              (char *ifname,uint16_t addr,uint16_t *rxfilter,uint rxfilter_count,
              char *publish_endpoint,char *subscribe_endpoint,uint32_t flags,
              csp_iface_t **return_interface)

{
  pthread_t *__newthread;
  pthread_t pVar1;
  undefined2 in_SI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  zmq_driver_t *drv;
  pthread_attr_t attributes;
  int ret;
  undefined8 in_stack_ffffffffffffff90;
  char *local_8;
  
  __newthread = (pthread_t *)calloc(1,0x90);
  local_8 = in_RDI;
  if (in_RDI == (char *)0x0) {
    local_8 = "ZMQHUB";
  }
  strncpy((char *)(__newthread + 4),local_8,10);
  __newthread[7] = (pthread_t)(__newthread + 4);
  __newthread[9] = (pthread_t)__newthread;
  __newthread[10] = (pthread_t)csp_zmqhub_tx;
  *(undefined2 *)(__newthread + 6) = in_SI;
  pVar1 = zmq_ctx_new();
  __newthread[1] = pVar1;
  pVar1 = zmq_socket(__newthread[1],1);
  __newthread[2] = pVar1;
  pVar1 = zmq_socket(__newthread[1],2);
  __newthread[3] = pVar1;
  zmq_setsockopt(__newthread[3],6,0);
  zmq_connect(__newthread[2],in_R8);
  zmq_connect(__newthread[3],in_R9);
  pthread_attr_init((pthread_attr_t *)&stack0xffffffffffffff90);
  pthread_attr_setdetachstate((pthread_attr_t *)&stack0xffffffffffffff90,1);
  pthread_create(__newthread,(pthread_attr_t *)&stack0xffffffffffffff90,csp_zmqhub_task,__newthread)
  ;
  csp_iflist_add((csp_iface_t *)in_stack_ffffffffffffff90);
  if (attributes._8_8_ != 0) {
    *(pthread_t **)attributes._8_8_ = __newthread + 6;
  }
  return 0;
}

Assistant:

int csp_zmqhub_init_w_name_endpoints_rxfilter(const char * ifname, uint16_t addr,
											  const uint16_t rxfilter[], unsigned int rxfilter_count,
											  const char * publish_endpoint,
											  const char * subscribe_endpoint,
											  uint32_t flags,
											  csp_iface_t ** return_interface) {

	int ret;
	pthread_attr_t attributes;
	zmq_driver_t * drv = calloc(1, sizeof(*drv));
	assert(drv != NULL);

	if (ifname == NULL) {
		ifname = CSP_ZMQHUB_IF_NAME;
	}

	strncpy(drv->name, ifname, sizeof(drv->name) - 1);
	drv->iface.name = drv->name;
	drv->iface.driver_data = drv;
	drv->iface.nexthop = csp_zmqhub_tx;
	drv->iface.addr = addr;

	drv->context = zmq_ctx_new();
	assert(drv->context != NULL);

	//csp_print("INIT %s: pub(tx): [%s], sub(rx): [%s], rx filters: %u", drv->iface.name, publish_endpoint, subscribe_endpoint, rxfilter_count);

	/* Publisher (TX) */
	drv->publisher = zmq_socket(drv->context, ZMQ_PUB);
	assert(drv->publisher != NULL);

	/* Subscriber (RX) */
	drv->subscriber = zmq_socket(drv->context, ZMQ_SUB);
	assert(drv->subscriber != NULL);

	// subscribe to all packets - no filter
	ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, NULL, 0);
	assert(ret == 0);

	/* Connect to server */
	ret = zmq_connect(drv->publisher, publish_endpoint);
	assert(ret == 0);
	zmq_connect(drv->subscriber, subscribe_endpoint);
	assert(ret == 0);

	/* Start RX thread */
	ret = pthread_attr_init(&attributes);
	assert(ret == 0);
	ret = pthread_attr_setdetachstate(&attributes, PTHREAD_CREATE_DETACHED);
	assert(ret == 0);
	ret = pthread_create(&drv->rx_thread, &attributes, csp_zmqhub_task, drv);
	assert(ret == 0);
	(void)ret;
	/* Register interface */
	csp_iflist_add(&drv->iface);

	if (return_interface) {
		*return_interface = &drv->iface;
	}

	return CSP_ERR_NONE;
}